

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

int SplittingStepGetNumEvolves(void *arkode_mem,int partition,long *evolves)

{
  long *in_RDX;
  int in_ESI;
  int k;
  int retval;
  ARKodeSplittingStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffcc;
  int local_4;
  
  local_4 = splittingStep_AccessARKODEStepMem
                      ((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (ARKodeSplittingStepMem *)0x196c1f);
  if (local_4 == 0) {
    if (in_ESI < iRam0000000000000018) {
      if (in_ESI < 0) {
        *in_RDX = 0;
        for (iVar1 = 0; iVar1 < iRam0000000000000018; iVar1 = iVar1 + 1) {
          *in_RDX = *(long *)(lRam0000000000000010 + (long)iVar1 * 8) + *in_RDX;
        }
      }
      else {
        *in_RDX = *(long *)(lRam0000000000000010 + (long)in_ESI * 8);
      }
      local_4 = 0;
    }
    else {
      arkProcessError((ARKodeMem)0x0,-0x16,0x2e4,"SplittingStepGetNumEvolves",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                      ,"The partition index is %i but there are only %i partitions",in_ESI,
                      iRam0000000000000018);
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int SplittingStepGetNumEvolves(void* arkode_mem, int partition, long int* evolves)
{
  ARKodeMem ark_mem               = NULL;
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                                 &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (partition >= step_mem->partitions)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "The partition index is %i but there are only %i partitions",
                    partition, step_mem->partitions);
    return ARK_ILL_INPUT;
  }

  if (partition < 0)
  {
    *evolves = 0;
    for (int k = 0; k < step_mem->partitions; k++)
    {
      *evolves += step_mem->n_stepper_evolves[k];
    }
  }
  else { *evolves = step_mem->n_stepper_evolves[partition]; }

  return ARK_SUCCESS;
}